

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LandmarkMapper.hpp
# Opt level: O0

optional<int>
eos::core::get_vertex_index
          (string *landmark_name,LandmarkMapper *landmark_mapper,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          *landmark_definitions)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pvVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_a0;
  const_iterator found_vertex_idx;
  int local_88 [2];
  int vertex_idx;
  string local_70;
  undefined1 local_50 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  converted_name;
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *landmark_definitions_local;
  LandmarkMapper *landmark_mapper_local;
  string *landmark_name_local;
  
  converted_name.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = landmark_definitions;
  std::__cxx11::string::string((string *)&local_70,(string *)landmark_name);
  LandmarkMapper::convert
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,landmark_mapper,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_50);
  if (!bVar1) {
    std::optional<int>::optional((optional<int> *)&landmark_name_local);
    goto LAB_001a9e33;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_50);
  __first._M_current = (char *)std::__cxx11::string::begin();
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_50);
  found_vertex_idx.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
             )std::__cxx11::string::end();
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )found_vertex_idx.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                               ._M_cur,isdigit);
  if (bVar1) {
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_50);
    local_88[0] = std::__cxx11::stoi(pbVar3,(size_t *)0x0,10);
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional *)
                       converted_name.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._32_8_);
    if (!bVar1) {
      std::optional<int>::optional((optional<int> *)&landmark_name_local);
      goto LAB_001a9e33;
    }
    puVar2 = std::
             optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
             ::value((optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                      *)converted_name.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_);
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_50);
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(puVar2,pbVar3);
    puVar2 = std::
             optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
             ::value((optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                      *)converted_name.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_);
    local_a8._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                   (puVar2);
    bVar1 = std::__detail::operator!=(&local_a0,&local_a8);
    if (!bVar1) {
      std::optional<int>::optional((optional<int> *)&landmark_name_local);
      goto LAB_001a9e33;
    }
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_a0);
    local_88[0] = pvVar4->second;
  }
  std::optional<int>::optional<int,_true>((optional<int> *)&landmark_name_local,local_88);
LAB_001a9e33:
  local_88[1] = 1;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)landmark_name_local;
}

Assistant:

inline cpp17::optional<int>
get_vertex_index(const std::string landmark_name, const core::LandmarkMapper& landmark_mapper,
                 const cpp17::optional<std::unordered_map<std::string, int>>& landmark_definitions)
{
    const auto converted_name = landmark_mapper.convert(landmark_name);
    if (!converted_name)
    { // no mapping defined for the current landmark
        return std::nullopt;
    }
    // If the MorphableModel does not contain landmark definitions, we expect the user to have given us
    // direct mappings (e.g. directly from ibug identifiers to vertex ids). If the model does contain
    // landmark definitions, we expect the user to use mappings from their landmark identifiers (e.g.
    // ibug) to the landmark definitions. Users may also include direct mappings to create a "hybrid" mapping.
    // Todo: This might be worth mentioning in the function documentation of fit_shape_and_pose.
    int vertex_idx;
    if (std::all_of(converted_name.value().begin(), converted_name.value().end(), ::isdigit))
    {
        vertex_idx = std::stoi(converted_name.value());
    } else
    {
        if (landmark_definitions)
        {
            const auto found_vertex_idx = landmark_definitions.value().find(converted_name.value());
            if (found_vertex_idx != std::end(landmark_definitions.value()))
            {
                vertex_idx = found_vertex_idx->second;
            } else
            {
                return cpp17::nullopt;
            }
        } else
        {
            return cpp17::nullopt;
        }
    }
    return vertex_idx;
}